

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blobs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  bool bVar1;
  int iVar2;
  bool help;
  allocator<char> local_380;
  allocator<char> local_37f;
  allocator<char> local_37e;
  allocator<char> local_37d;
  allocator<char> local_37c;
  allocator<char> local_37b;
  allocator<char> local_37a;
  allocator<char> local_379;
  __uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_> local_378;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_370;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_368;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_360;
  environment env;
  communicator world;
  string log_level;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  Options ops;
  string local_1d0 [32];
  Session session;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  Catch::Session::Session(&session);
  BlobsFixture::nblocks = 2;
  if (2 < world.size_) {
    BlobsFixture::nblocks = world.size_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_level,"info",(allocator<char> *)&ops);
  this = &ops.options;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&ops;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"blocks",&local_379);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"number of blocks",&local_37a);
  opts::Option<int>((opts *)&local_360,'b',&local_228,&BlobsFixture::nblocks,&local_248);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_360);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"thread",&local_37b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"number of threads",&local_37c);
  opts::Option<int>((opts *)&local_368,'t',&local_268,&BlobsFixture::threads,&local_288);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_368);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"log",&local_37d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"log level",&local_37e);
  opts::Option<std::__cxx11::string>((opts *)&local_370,'l',&local_2a8,&log_level,&local_2c8);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_370);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"help",&local_37f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"show help",&local_380);
  opts::Option<bool>((opts *)&local_378,'h',&local_2e8,&help,&local_308);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_378);
  if ((_Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)
      local_378._M_t.
      super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>.
      super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl != (BasicOption *)0x0) {
    (**(code **)(*(long *)local_378._M_t.
                          super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>
                          .super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl + 8))();
  }
  local_378._M_t.
  super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>.
  super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl =
       (tuple<opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)
       (_Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)0x0;
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (local_370._M_head_impl != (BasicOption *)0x0) {
    (*(local_370._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_370._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  if (local_368._M_head_impl != (BasicOption *)0x0) {
    (*(local_368._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_368._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  if (local_360._M_head_impl != (BasicOption *)0x0) {
    (*(local_360._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_360._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if (((bVar1) && (help != true)) || (world.rank_ != 0)) {
    std::__cxx11::string::string(local_1d0,(string *)&log_level);
    Catch::clara::std::make_shared<diy::spd::logger>();
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_310);
    std::__cxx11::string::~string(local_1d0);
    iVar2 = Catch::Session::run(&session);
  }
  else {
    opts::operator<<((ostream *)&std::cout,&ops);
    iVar2 = 1;
  }
  opts::Options::~Options(&ops);
  std::__cxx11::string::~string((string *)&log_level);
  Catch::Session::~Session(&session);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator world;

  Catch::Session session;

  BlobsFixture::nblocks = (std::max)(world.size(), 2);
  bool help;

  std::string log_level   = "info";

  // get command line arguments
  using namespace opts;
  Options ops;
  ops >> Option('b', "blocks", BlobsFixture::nblocks, "number of blocks")
      >> Option('t', "thread", BlobsFixture::threads, "number of threads")
      >> Option('l', "log",    log_level,              "log level")
      >> Option('h', "help",   help,                   "show help");
  if (!ops.parse(argc,argv) || help)
  {
    if (world.rank() == 0)
    {
      std::cout << ops;
      return 1;
    }
  }

  diy::create_logger(log_level);

  return session.run();
}